

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O2

bool __thiscall QJsonObject::contains(QJsonObject *this,QLatin1StringView key)

{
  bool bVar1;
  
  bVar1 = containsImpl<QLatin1String>(this,key);
  return bVar1;
}

Assistant:

bool QJsonObject::contains(QLatin1StringView key) const
{
    return containsImpl(key);
}